

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValueAndRemove
          (BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,CacheIdUnit *value)

{
  uint uVar1;
  Type piVar2;
  hash_t hVar3;
  Type pSVar4;
  ulong uVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  uint depth;
  
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 != (Type)0x0) {
    hVar3 = PrimePolicy::ModPrime(*key & 0x7fffffff,this->bucketCount,this->modFunctionIndex);
    uVar6 = piVar2[hVar3];
    uVar9 = (ulong)(int)uVar6;
    depth = 0;
    if (-1 < (long)uVar9) {
      pSVar4 = this->entries;
      if (pSVar4[uVar9].
          super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
          super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
          .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.key == *key
         ) {
        depth = 0;
        uVar8 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          depth = depth + 1;
          uVar1 = pSVar4[uVar6].
                  super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
                  super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
                  next;
          uVar9 = (ulong)(int)uVar1;
          if ((long)uVar9 < 0) goto LAB_00898ec3;
          uVar8 = (ulong)uVar6;
          uVar6 = uVar1;
        } while (pSVar4[uVar9].
                 super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
                 super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
                 .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.key
                 != *key);
      }
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
        pSVar4 = this->entries;
      }
      uVar5 = uVar9 & 0xffffffff;
      value->isRootObjectCache =
           pSVar4[uVar5].
           super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
           super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
           .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.value.
           isRootObjectCache;
      value->cacheId =
           pSVar4[uVar5].
           super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
           super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
           .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.value.
           cacheId;
      pSVar4 = this->entries;
      piVar7 = &pSVar4[uVar8].
                super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
                super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.next;
      if ((int)uVar8 < 0) {
        piVar7 = this->buckets + hVar3;
      }
      *piVar7 = pSVar4[uVar5].
                super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
                super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.next;
      pSVar4[uVar5].
      super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
      super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.value.cacheId =
           0;
      pSVar4[uVar5].
      super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
      super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.value.
      isRootObjectCache = false;
      pSVar4[uVar5].
      super_DefaultHashedEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.
      super_ValueEntry<Js::ByteCodeWriter::CacheIdUnit,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit>.key = 0;
      SetNextFreeEntryIndex(this,pSVar4 + uVar5,-(uint)(this->freeCount == 0) | this->freeList);
      this->freeList = (Type)uVar9;
      this->freeCount = this->freeCount + 1;
      if (this->stats == (DictionaryStats *)0x0) {
        return true;
      }
      DictionaryStats::Remove(this->stats,this->buckets[hVar3] == -1);
      return true;
    }
  }
LAB_00898ec3:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool TryGetValueAndRemove(const TKey& key, TValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = entries[i].Value();
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }